

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O3

void __thiscall ManifestFile::ParseCommon(ManifestFile *this,Value *root_node)

{
  _Alloc_hider _Var1;
  bool bVar2;
  Value *pVVar3;
  Value *pVVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  ValueHolder VVar8;
  const_iterator cVar9;
  ExtensionListing ext_listing;
  Value ext_name;
  Value ext_version;
  value_type local_100;
  ValueHolder local_d8;
  undefined1 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_b0;
  ManifestFile *local_a8;
  ValueHolder local_a0;
  long local_98;
  size_type local_90;
  long lStack_88;
  String local_78;
  ValueIteratorBase local_50;
  SelfType local_40;
  
  local_a8 = this;
  pVVar3 = Json::Value::operator[](root_node,"instance_extensions");
  bVar2 = Json::Value::isNull(pVVar3);
  if ((!bVar2) && (bVar2 = Json::Value::isArray(pVVar3), bVar2)) {
    cVar9 = Json::Value::begin(pVVar3);
    local_50.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_50.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    cVar9 = Json::Value::end(pVVar3);
    local_40.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    bVar2 = Json::ValueIteratorBase::isEqual(&local_50,&local_40);
    if (!bVar2) {
      local_b0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_a8->_instance_extensions;
      do {
        pVVar3 = Json::ValueIteratorBase::deref(&local_50);
        pVVar4 = Json::Value::operator[](pVVar3,"name");
        Json::Value::Value((Value *)&local_d8,pVVar4);
        pVVar3 = Json::Value::operator[](pVVar3,"extension_version");
        Json::Value::Value((Value *)&local_a0,pVVar3);
        bVar2 = Json::Value::isString((Value *)&local_d8);
        if ((bVar2) &&
           ((bVar2 = Json::Value::isString((Value *)&local_a0), bVar2 ||
            (bVar2 = Json::Value::isUInt((Value *)&local_a0), bVar2)))) {
          local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
          local_100.name._M_string_length = 0;
          local_100.name.field_2._M_local_buf[0] = '\0';
          local_100.extension_version = 0;
          Json::Value::asString_abi_cxx11_(&local_78,(Value *)&local_d8);
          std::__cxx11::string::operator=((string *)&local_100,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          bVar2 = Json::Value::isUInt((Value *)&local_a0);
          if (bVar2) {
            local_100.extension_version = Json::Value::asUInt((Value *)&local_a0);
          }
          else {
            Json::Value::asString_abi_cxx11_(&local_78,(Value *)&local_a0);
            _Var1._M_p = local_78._M_dataplus._M_p;
            local_100.extension_version = atoi(local_78._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var1._M_p != &local_78.field_2) {
              operator_delete(_Var1._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
          std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>::push_back
                    ((vector<ExtensionListing,_std::allocator<ExtensionListing>_> *)local_b0,
                     &local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
            operator_delete(local_100.name._M_dataplus._M_p,
                            CONCAT71(local_100.name.field_2._M_allocated_capacity._1_7_,
                                     local_100.name.field_2._M_local_buf[0]) + 1);
          }
        }
        Json::Value::~Value((Value *)&local_a0);
        Json::Value::~Value((Value *)&local_d8);
        Json::ValueIteratorBase::increment(&local_50);
        bVar2 = Json::ValueIteratorBase::isEqual(&local_50,&local_40);
      } while (!bVar2);
    }
  }
  pVVar3 = Json::Value::operator[](root_node,"functions");
  bVar2 = Json::Value::isNull(pVVar3);
  if ((!bVar2) && (bVar2 = Json::Value::empty(pVVar3), !bVar2)) {
    cVar9 = Json::Value::begin(pVVar3);
    local_50.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_50.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    cVar9 = Json::Value::end(pVVar3);
    local_d8.int_ = (LargestInt)cVar9.super_ValueIteratorBase.current_._M_node;
    local_d0 = cVar9.super_ValueIteratorBase.isNull_;
    bVar2 = Json::ValueIteratorBase::isEqual(&local_50,(SelfType *)&local_d8);
    if (!bVar2) {
      local_b0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_a8->_functions_renamed;
      do {
        pVVar4 = Json::ValueIteratorBase::deref(&local_50);
        bVar2 = Json::Value::isString(pVVar4);
        if (bVar2) {
          Json::ValueIteratorBase::key((Value *)&local_d8,&local_50);
          Json::Value::asString_abi_cxx11_((String *)&local_a0,(Value *)&local_d8);
          Json::Value::~Value((Value *)&local_d8);
          pVVar4 = Json::ValueIteratorBase::deref(&local_50);
          Json::Value::asString_abi_cxx11_((String *)&local_d8,pVVar4);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>(local_b0,&local_a0,&local_d8);
          if (local_d8 != &local_c8) {
            operator_delete(local_d8.string_,local_c8._M_allocated_capacity + 1);
          }
          uVar7 = local_90;
          VVar8 = local_a0;
          if (local_a0 != &local_90) {
LAB_00115789:
            operator_delete(VVar8.string_,uVar7 + 1);
          }
        }
        else {
          local_d8.string_ = (char *)&local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
          std::operator+(&local_100.name,"ManifestFile::ParseCommon ",&local_a8->_filename);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar6) {
            local_90 = paVar6->_M_allocated_capacity;
            lStack_88 = plVar5[3];
            local_a0.string_ = (char *)&local_90;
          }
          else {
            local_90 = paVar6->_M_allocated_capacity;
            local_a0.string_ = ((char *)*plVar5).string_;
          }
          local_98 = plVar5[1];
          *plVar5 = (long)paVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_78.field_2._M_allocated_capacity = 0;
          local_78._M_dataplus._M_p = (char *)0x0;
          local_78._M_string_length = 0;
          LoaderLogger::LogWarningMessage
                    ((string *)&local_d8,(string *)&local_a0,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_78);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_78);
          if (local_a0 != &local_90) {
            operator_delete(local_a0.string_,local_90 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
            operator_delete(local_100.name._M_dataplus._M_p,
                            CONCAT71(local_100.name.field_2._M_allocated_capacity._1_7_,
                                     local_100.name.field_2._M_local_buf[0]) + 1);
          }
          uVar7 = local_c8._M_allocated_capacity;
          VVar8 = local_d8;
          if (local_d8 != &local_c8) goto LAB_00115789;
        }
        Json::ValueIteratorBase::increment(&local_50);
        cVar9 = Json::Value::end(pVVar3);
        local_d8.int_ = (LargestInt)cVar9.super_ValueIteratorBase.current_._M_node;
        local_d0 = cVar9.super_ValueIteratorBase.isNull_;
        bVar2 = Json::ValueIteratorBase::isEqual(&local_50,(SelfType *)&local_d8);
      } while (!bVar2);
    }
  }
  return;
}

Assistant:

void ManifestFile::ParseCommon(Json::Value const &root_node) {
    const Json::Value &inst_exts = root_node["instance_extensions"];
    if (!inst_exts.isNull() && inst_exts.isArray()) {
        for (const auto &ext : inst_exts) {
            ParseExtension(ext, _instance_extensions);
        }
    }
    const Json::Value &funcs_renamed = root_node["functions"];
    if (!funcs_renamed.isNull() && !funcs_renamed.empty()) {
        for (Json::ValueConstIterator func_it = funcs_renamed.begin(); func_it != funcs_renamed.end(); ++func_it) {
            if (!(*func_it).isString()) {
                LoaderLogger::LogWarningMessage(
                    "", "ManifestFile::ParseCommon " + _filename + " \"functions\" section contains non-string values.");
                continue;
            }
            std::string original_name = func_it.key().asString();
            std::string new_name = (*func_it).asString();
            _functions_renamed.emplace(original_name, new_name);
        }
    }
}